

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_zeroblob64(sqlite3_stmt *pStmt,int i,sqlite3_uint64 n)

{
  int iVar1;
  Vdbe *p;
  int rc;
  sqlite3_uint64 n_local;
  int i_local;
  sqlite3_stmt *pStmt_local;
  
  sqlite3_mutex_enter(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  if ((ulong)(long)*(int *)(*(long *)pStmt + 0x70) < n) {
    p._4_4_ = 0x12;
  }
  else {
    p._4_4_ = sqlite3_bind_zeroblob(pStmt,i,(int)n);
  }
  iVar1 = sqlite3ApiExit(*(sqlite3 **)pStmt,p._4_4_);
  sqlite3_mutex_leave(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_zeroblob64(sqlite3_stmt *pStmt, int i, sqlite3_uint64 n){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  sqlite3_mutex_enter(p->db->mutex);
  if( n>(u64)p->db->aLimit[SQLITE_LIMIT_LENGTH] ){
    rc = SQLITE_TOOBIG;
  }else{
    assert( (n & 0x7FFFFFFF)==n );
    rc = sqlite3_bind_zeroblob(pStmt, i, n);
  }
  rc = sqlite3ApiExit(p->db, rc);
  sqlite3_mutex_leave(p->db->mutex);
  return rc;
}